

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::InitFrom(EpsCopyInputStream *this,StringPiece flat)

{
  stringpiece_ssize_type sVar1;
  char *pcVar2;
  size_t __n;
  long lVar3;
  long *in_RDI;
  StringPiece local_18;
  long *local_8;
  
  *(undefined4 *)((long)in_RDI + 0x54) = 0;
  sVar1 = StringPiece::size(&local_18);
  if (sVar1 < 0x11) {
    pcVar2 = StringPiece::data(&local_18);
    __n = StringPiece::size(&local_18);
    memcpy(in_RDI + 5,pcVar2,__n);
    *(undefined4 *)((long)in_RDI + 0x1c) = 0;
    sVar1 = StringPiece::size(&local_18);
    lVar3 = (long)in_RDI + sVar1 + 0x28;
    in_RDI[1] = lVar3;
    *in_RDI = lVar3;
    in_RDI[2] = 0;
    if (in_RDI[9] == 1) {
      pcVar2 = StringPiece::data(&local_18);
      in_RDI[9] = (long)pcVar2 - (long)(in_RDI + 5);
    }
    local_8 = in_RDI + 5;
  }
  else {
    *(undefined4 *)((long)in_RDI + 0x1c) = 0x10;
    pcVar2 = StringPiece::data(&local_18);
    sVar1 = StringPiece::size(&local_18);
    in_RDI[1] = (long)(pcVar2 + sVar1 + -0x10);
    *in_RDI = (long)(pcVar2 + sVar1 + -0x10);
    in_RDI[2] = (long)(in_RDI + 5);
    if (in_RDI[9] == 1) {
      in_RDI[9] = 2;
    }
    local_8 = (long *)StringPiece::data(&local_18);
  }
  return (char *)local_8;
}

Assistant:

const char* InitFrom(StringPiece flat) {
    overall_limit_ = 0;
    if (flat.size() > kSlopBytes) {
      limit_ = kSlopBytes;
      limit_end_ = buffer_end_ = flat.data() + flat.size() - kSlopBytes;
      next_chunk_ = buffer_;
      if (aliasing_ == kOnPatch) aliasing_ = kNoDelta;
      return flat.data();
    } else {
      std::memcpy(buffer_, flat.data(), flat.size());
      limit_ = 0;
      limit_end_ = buffer_end_ = buffer_ + flat.size();
      next_chunk_ = nullptr;
      if (aliasing_ == kOnPatch) {
        aliasing_ = reinterpret_cast<std::uintptr_t>(flat.data()) -
                    reinterpret_cast<std::uintptr_t>(buffer_);
      }
      return buffer_;
    }
  }